

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

StringMap * stringmap_create(int copy,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  code *nukefn;
  HashTable *pHVar1;
  StringMap *smap;
  HashTable_NukeFn nuke;
  void *d_local;
  MOJOSHADER_free f_local;
  MOJOSHADER_malloc m_local;
  int copy_local;
  
  nukefn = stringmap_nuke_noop;
  if (copy != 0) {
    nukefn = stringmap_nuke;
  }
  pHVar1 = hash_create((void *)0x0,hash_hash_string,hash_keymatch_string,nukefn,0,m,f,d);
  if (pHVar1 != (HashTable *)0x0) {
    pHVar1->data = pHVar1;
  }
  return pHVar1;
}

Assistant:

StringMap *stringmap_create(const int copy, MOJOSHADER_malloc m,
                            MOJOSHADER_free f, void *d)
{
    HashTable_NukeFn nuke = copy ? stringmap_nuke : stringmap_nuke_noop;
    StringMap *smap;
    smap = hash_create(0,hash_hash_string,hash_keymatch_string,nuke,0,m,f,d);
    if (smap != NULL)
        smap->data = smap;
    return smap;
}